

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# entries.cpp
# Opt level: O2

Data * DL::Expressions::union_func(Data *__return_storage_ptr__,vector_t<Data> *args,VM *param_2)

{
  Data *pDVar1;
  pointer pDVar2;
  pointer pDVar3;
  long lVar4;
  DataGroup *pDVar5;
  vector_t<Data> *pvVar6;
  Data *data;
  pointer pDVar7;
  pointer this;
  allocator local_61;
  DataGroup grp;
  string_t local_50;
  
  pDVar1 = (args->super__Vector_base<DL::Data,_std::allocator<DL::Data>_>)._M_impl.
           super__Vector_impl_data._M_start;
  lVar4 = ((long)(args->super__Vector_base<DL::Data,_std::allocator<DL::Data>_>)._M_impl.
                 super__Vector_impl_data._M_finish - (long)pDVar1) / 0x60;
  if (lVar4 == 1) {
    Data::Data(__return_storage_ptr__,pDVar1);
  }
  else if (lVar4 == 0) {
    std::__cxx11::string::string((string *)&local_50,"",(allocator *)&grp);
    Data::Data(__return_storage_ptr__,&local_50);
    std::__cxx11::string::~string((string *)&local_50);
  }
  else {
    std::__cxx11::string::string((string *)&local_50,"",&local_61);
    DataGroup::DataGroup(&grp,&local_50);
    std::__cxx11::string::~string((string *)&local_50);
    pDVar2 = (args->super__Vector_base<DL::Data,_std::allocator<DL::Data>_>)._M_impl.
             super__Vector_impl_data._M_finish;
    for (this = (args->super__Vector_base<DL::Data,_std::allocator<DL::Data>_>)._M_impl.
                super__Vector_impl_data._M_start; this != pDVar2; this = this + 1) {
      if (this->mType == DT_Group) {
        pDVar5 = Data::getGroup(this);
        pvVar6 = DataGroup::getNamedEntries(pDVar5);
        pDVar3 = (pvVar6->super__Vector_base<DL::Data,_std::allocator<DL::Data>_>)._M_impl.
                 super__Vector_impl_data._M_finish;
        for (pDVar7 = (pvVar6->super__Vector_base<DL::Data,_std::allocator<DL::Data>_>)._M_impl.
                      super__Vector_impl_data._M_start; pDVar7 != pDVar3; pDVar7 = pDVar7 + 1) {
          DataGroup::add(&grp,pDVar7);
        }
        pDVar5 = Data::getGroup(this);
        pvVar6 = DataGroup::getAnonymousEntries(pDVar5);
        pDVar3 = (pvVar6->super__Vector_base<DL::Data,_std::allocator<DL::Data>_>)._M_impl.
                 super__Vector_impl_data._M_finish;
        for (pDVar7 = (pvVar6->super__Vector_base<DL::Data,_std::allocator<DL::Data>_>)._M_impl.
                      super__Vector_impl_data._M_start; pDVar7 != pDVar3; pDVar7 = pDVar7 + 1) {
          DataGroup::add(&grp,pDVar7);
        }
      }
      else {
        DataGroup::add(&grp,this);
      }
    }
    std::__cxx11::string::string((string *)&local_50,"",&local_61);
    Data::Data(__return_storage_ptr__,&local_50);
    std::__cxx11::string::~string((string *)&local_50);
    Data::setGroup(__return_storage_ptr__,&grp);
    DataGroup::~DataGroup(&grp);
  }
  return __return_storage_ptr__;
}

Assistant:

Data union_func(const vector_t<Data>& args, VM& /*vm*/)
{
	if (args.size() == 0) {
		return Data();
	} else if (args.size() == 1) {
		return args.front();
	} else {
		DataGroup grp;
		for (const Data& d : args) {
			if (d.type() == DT_Group) {
				for (const Data& data : d.getGroup().getNamedEntries())
					grp.add(data);

				for (const Data& data : d.getGroup().getAnonymousEntries())
					grp.add(data);
			} else {
				grp.add(d);
			}
		}

		Data r;
		r.setGroup(grp);
		return r;
	}
}